

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

vector<int,_std::allocator<int>_> *
Intersect<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
              vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  pointer piVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  int *x;
  pointer piVar10;
  vector<int,_std::allocator<int>_> *__range1;
  int *x_2;
  set<int,_std::less<int>,_std::allocator<int>_> sB;
  set<int,_std::less<int>,_std::allocator<int>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> sA;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar10 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar4 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (piVar10 != piVar4) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,piVar10);
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
  }
  piVar10 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar4 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar10 != piVar4) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_c0,piVar10);
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
  }
  piVar10 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar4 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar10 != piVar4) {
    do {
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        iVar2 = *piVar10;
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var1->_M_header;
        do {
          p_Var8 = p_Var9;
          p_Var7 = p_Var6;
          _Var3 = p_Var7[1]._M_color;
          p_Var9 = p_Var7;
          if ((int)_Var3 < iVar2) {
            p_Var9 = p_Var8;
          }
          p_Var6 = (&p_Var7->_M_left)[(int)_Var3 < iVar2];
        } while ((&p_Var7->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          if ((int)_Var3 < iVar2) {
            p_Var7 = p_Var8;
          }
          if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0 &&
              (int)p_Var7[1]._M_color <= iVar2) {
            p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var9 = &local_c0._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var8 = p_Var9;
              p_Var7 = p_Var6;
              _Var3 = p_Var7[1]._M_color;
              p_Var9 = p_Var7;
              if ((int)_Var3 < iVar2) {
                p_Var9 = p_Var8;
              }
              p_Var6 = (&p_Var7->_M_left)[(int)_Var3 < iVar2];
            } while ((&p_Var7->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var9 != &local_c0._M_impl.super__Rb_tree_header) {
              if ((int)_Var3 < iVar2) {
                p_Var7 = p_Var8;
              }
              if ((int)p_Var7[1]._M_color <= iVar2) {
                iVar5._M_current =
                     (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar5,piVar10
                            );
                }
                else {
                  *iVar5._M_current = iVar2;
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_90,piVar10);
              }
            }
          }
        }
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
    piVar4 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar10 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar4; piVar10 = piVar10 + 1) {
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        iVar2 = *piVar10;
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var1->_M_header;
        do {
          p_Var8 = p_Var9;
          p_Var7 = p_Var6;
          _Var3 = p_Var7[1]._M_color;
          p_Var9 = p_Var7;
          if ((int)_Var3 < iVar2) {
            p_Var9 = p_Var8;
          }
          p_Var6 = (&p_Var7->_M_left)[(int)_Var3 < iVar2];
        } while ((&p_Var7->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          if ((int)_Var3 < iVar2) {
            p_Var7 = p_Var8;
          }
          if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0 &&
              (int)p_Var7[1]._M_color <= iVar2) {
            p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var9 = &local_c0._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var8 = p_Var9;
              p_Var7 = p_Var6;
              _Var3 = p_Var7[1]._M_color;
              p_Var9 = p_Var7;
              if ((int)_Var3 < iVar2) {
                p_Var9 = p_Var8;
              }
              p_Var6 = (&p_Var7->_M_left)[(int)_Var3 < iVar2];
            } while ((&p_Var7->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var9 != &local_c0._M_impl.super__Rb_tree_header) {
              if ((int)_Var3 < iVar2) {
                p_Var7 = p_Var8;
              }
              if ((int)p_Var7[1]._M_color <= iVar2) {
                if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                  p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var9 = &local_90._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var8 = p_Var9;
                    p_Var7 = p_Var6;
                    _Var3 = p_Var7[1]._M_color;
                    p_Var9 = p_Var7;
                    if ((int)_Var3 < iVar2) {
                      p_Var9 = p_Var8;
                    }
                    p_Var6 = (&p_Var7->_M_left)[(int)_Var3 < iVar2];
                  } while ((&p_Var7->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var9 != &local_90._M_impl.super__Rb_tree_header) {
                    if ((int)_Var3 < iVar2) {
                      p_Var7 = p_Var8;
                    }
                    if ((int)p_Var7[1]._M_color <= iVar2) goto LAB_001019fa;
                  }
                }
                iVar5._M_current =
                     (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar5,piVar10
                            );
                }
                else {
                  *iVar5._M_current = iVar2;
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
              }
            }
          }
        }
      }
LAB_001019fa:
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  return __return_storage_ptr__;
}

Assistant:

vector<T> Intersect(const vector<T> &A, const vector<T> &B) {
    vector<T> v;
    set<T> s;
    set<T> sA;
    set<T> sB;
    for (auto &x : A) {
        sA.insert(x);
    }
    for (auto &x : B) {
        sB.insert(x);
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end()) {
            v.emplace_back(x);
            s.insert(x);
        }
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end() && s.find(x) == s.end()) {
            v.emplace_back(x);
        }
    }
    return v;
}